

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O2

void htmlParseContentInternal(htmlParserCtxtPtr ctxt)

{
  byte bVar1;
  __int32_t *p_Var2;
  xmlChar *pxVar3;
  endElementSAXFunc p_Var4;
  xmlChar xVar5;
  int iVar6;
  int iVar7;
  xmlChar *str1;
  xmlChar *pxVar8;
  __int32_t **pp_Var9;
  htmlElemDesc *phVar10;
  xmlParserInputPtr pxVar11;
  htmlParserNodeInfo local_58;
  
  str1 = xmlStrdup(ctxt->name);
  iVar7 = ctxt->nameNr;
LAB_0014a79b:
  if ((ctxt->progressive == 0) &&
     (pxVar11 = ctxt->input, (long)pxVar11->end - (long)pxVar11->cur < 0xfa)) {
    xmlParserInputGrow(pxVar11,0xfa);
  }
  if (ctxt->instate == XML_PARSER_EOF) goto LAB_0014ac22;
  pxVar8 = ctxt->input->cur;
  if (*pxVar8 != '<') goto LAB_0014a83c;
  bVar1 = pxVar8[1];
  if (bVar1 == 0x2f) goto LAB_0014a8d5;
  if ((((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a) || (bVar1 == 0x5f)) || (bVar1 == 0x3a)) {
    pxVar8 = htmlParseHTMLName_nonInvasive(ctxt);
    if (pxVar8 != (xmlChar *)0x0) {
      if ((ctxt->name == (xmlChar *)0x0) ||
         (iVar6 = htmlCheckAutoClose(pxVar8,ctxt->name), iVar6 == 0)) goto LAB_0014a83c;
      htmlAutoClose(ctxt,pxVar8);
      goto LAB_0014a79b;
    }
    htmlParseErr(ctxt,XML_ERR_NAME_REQUIRED,"htmlParseStartTag: invalid element name\n",
                 (xmlChar *)0x0,(xmlChar *)0x0);
    while (*ctxt->input->cur == '\0') {
      xmlNextChar(ctxt);
    }
  }
  else {
LAB_0014a83c:
    if (((ctxt->nameNr < 1) || (iVar7 < ctxt->nameNr)) ||
       (iVar6 = xmlStrEqual(str1,ctxt->name), iVar6 != 0)) {
      if (*ctxt->input->cur == '\0') {
LAB_0014ac1a:
        htmlAutoCloseOnEnd(ctxt);
LAB_0014ac22:
        if (str1 == (xmlChar *)0x0) {
          return;
        }
        (*xmlFree)(str1);
        return;
      }
      iVar6 = xmlStrEqual(str1,"script");
      if ((iVar6 == 0) && (iVar6 = xmlStrEqual(str1,"style"), iVar6 == 0)) {
        pxVar11 = ctxt->input;
        pxVar8 = pxVar11->cur;
        xVar5 = *pxVar8;
        if (xVar5 == '<') {
          if (pxVar8[1] == '!') {
            pp_Var9 = __ctype_toupper_loc();
            p_Var2 = *pp_Var9;
            if (((((p_Var2[pxVar8[2]] == 0x44) && (p_Var2[pxVar8[3]] == 0x4f)) &&
                 (p_Var2[pxVar8[4]] == 0x43)) &&
                ((p_Var2[pxVar8[5]] == 0x54 && (p_Var2[pxVar8[6]] == 0x59)))) &&
               ((p_Var2[pxVar8[7]] == 0x50 && (p_Var2[pxVar8[8]] == 0x45)))) {
              htmlParseErr(ctxt,XML_HTML_STRUCURE_ERROR,"Misplaced DOCTYPE declaration\n",
                           (xmlChar *)"DOCTYPE",(xmlChar *)0x0);
              htmlParseDocTypeDecl(ctxt);
              pxVar11 = ctxt->input;
              pxVar8 = pxVar11->cur;
              xVar5 = *pxVar8;
              goto LAB_0014aa05;
            }
          }
LAB_0014aa31:
          if (pxVar8[1] == '?') {
            htmlParsePI(ctxt);
          }
          else if (((pxVar8[1] == '!') && (pxVar8[2] == '-')) && (pxVar8[3] == '-')) {
            htmlParseComment(ctxt);
          }
          else {
            local_58.end_line = 0;
            local_58.begin_line = 0;
            local_58.end_pos = 0;
            local_58.node = (_xmlNode *)0x0;
            local_58.begin_pos = 0;
            if (ctxt->instate != XML_PARSER_EOF) {
              if (ctxt->record_info != 0) {
                local_58.begin_pos =
                     (unsigned_long)(pxVar8 + (pxVar11->consumed - (long)pxVar11->base));
                local_58.begin_line = (unsigned_long)pxVar11->line;
              }
              iVar7 = htmlParseStartTag(ctxt);
              pxVar8 = ctxt->name;
              if (pxVar8 == (xmlChar *)0x0 || iVar7 == -1) {
                if (*ctxt->input->cur == '>') {
                  xmlNextChar(ctxt);
                }
              }
              else {
                phVar10 = htmlTagLookup(pxVar8);
                if (phVar10 == (htmlElemDesc *)0x0) {
                  htmlParseErr(ctxt,XML_HTML_UNKNOWN_TAG,"Tag %s invalid\n",pxVar8,(xmlChar *)0x0);
                }
                pxVar11 = ctxt->input;
                pxVar3 = pxVar11->cur;
                if (*pxVar3 == '>') {
                  xmlNextChar(ctxt);
                  if ((phVar10 != (htmlElemDesc *)0x0) && (phVar10->empty != '\0'))
                  goto LAB_0014abb2;
                  if (ctxt->record_info != 0) {
                    htmlNodeInfoPush(ctxt,&local_58);
                  }
                }
                else if ((*pxVar3 == '/') && (pxVar3[1] == '>')) {
                  pxVar11->cur = pxVar3 + 2;
                  pxVar11->col = pxVar11->col + 2;
LAB_0014abb2:
                  if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
                     (p_Var4 = ctxt->sax->endElement, p_Var4 != (endElementSAXFunc)0x0)) {
                    (*p_Var4)(ctxt->userData,pxVar8);
                  }
                  htmlnamePop(ctxt);
                }
                else {
                  htmlParseErr(ctxt,XML_ERR_GT_REQUIRED,"Couldn\'t find end of Start Tag %s\n",
                               pxVar8,(xmlChar *)0x0);
                  iVar7 = xmlStrEqual(pxVar8,ctxt->name);
                  if (iVar7 != 0) {
                    nodePop(ctxt);
                    htmlnamePop(ctxt);
                  }
                  if (ctxt->record_info != 0) {
                    htmlNodeInfoPush(ctxt,&local_58);
                  }
                  htmlParserFinishElementParsing(ctxt);
                }
              }
            }
            if (str1 != (xmlChar *)0x0) {
              (*xmlFree)(str1);
            }
            str1 = xmlStrdup(ctxt->name);
            iVar7 = ctxt->nameNr;
          }
        }
        else {
LAB_0014aa05:
          if (xVar5 == '&') {
            htmlParseReference(ctxt);
          }
          else {
            if (xVar5 == '<') goto LAB_0014aa31;
            if (xVar5 == '\0') goto LAB_0014ac1a;
            htmlParseCharData(ctxt);
          }
        }
      }
      else {
        htmlParseScript(ctxt);
      }
      if ((ctxt->progressive == 0) &&
         (pxVar11 = ctxt->input, (long)pxVar11->end - (long)pxVar11->cur < 0xfa)) {
        xmlParserInputGrow(pxVar11,0xfa);
      }
      goto LAB_0014a79b;
    }
  }
  htmlParserFinishElementParsing(ctxt);
  if (str1 != (xmlChar *)0x0) goto LAB_0014a936;
  goto LAB_0014a942;
LAB_0014a8d5:
  iVar6 = htmlParseEndTag(ctxt);
  if (iVar6 != 0) {
    if (str1 == (xmlChar *)0x0) {
      str1 = (xmlChar *)0x0;
      if (ctxt->nameNr != 0) goto LAB_0014a79b;
    }
    else {
LAB_0014a936:
      (*xmlFree)(str1);
    }
LAB_0014a942:
    str1 = xmlStrdup(ctxt->name);
    iVar7 = ctxt->nameNr;
  }
  goto LAB_0014a79b;
}

Assistant:

static void
htmlParseContentInternal(htmlParserCtxtPtr ctxt) {
    xmlChar *currentNode;
    int depth;
    const xmlChar *name;

    currentNode = xmlStrdup(ctxt->name);
    depth = ctxt->nameNr;
    while (1) {
        GROW;

        if (ctxt->instate == XML_PARSER_EOF)
            break;

	/*
	 * Our tag or one of it's parent or children is ending.
	 */
        if ((CUR == '<') && (NXT(1) == '/')) {
	    if (htmlParseEndTag(ctxt) &&
		((currentNode != NULL) || (ctxt->nameNr == 0))) {
		if (currentNode != NULL)
		    xmlFree(currentNode);

	        currentNode = xmlStrdup(ctxt->name);
	        depth = ctxt->nameNr;
	    }
	    continue; /* while */
        }

	else if ((CUR == '<') &&
	         ((IS_ASCII_LETTER(NXT(1))) ||
		  (NXT(1) == '_') || (NXT(1) == ':'))) {
	    name = htmlParseHTMLName_nonInvasive(ctxt);
	    if (name == NULL) {
	        htmlParseErr(ctxt, XML_ERR_NAME_REQUIRED,
			 "htmlParseStartTag: invalid element name\n",
			 NULL, NULL);
	        /* Dump the bogus tag like browsers do */
	        while ((CUR == 0) && (CUR != '>'))
	            NEXT;

	        htmlParserFinishElementParsing(ctxt);
	        if (currentNode != NULL)
	            xmlFree(currentNode);

	        currentNode = xmlStrdup(ctxt->name);
	        depth = ctxt->nameNr;
	        continue;
	    }

	    if (ctxt->name != NULL) {
	        if (htmlCheckAutoClose(name, ctxt->name) == 1) {
	            htmlAutoClose(ctxt, name);
	            continue;
	        }
	    }
	}

	/*
	 * Has this node been popped out during parsing of
	 * the next element
	 */
        if ((ctxt->nameNr > 0) && (depth >= ctxt->nameNr) &&
	    (!xmlStrEqual(currentNode, ctxt->name)))
	     {
	    htmlParserFinishElementParsing(ctxt);
	    if (currentNode != NULL) xmlFree(currentNode);

	    currentNode = xmlStrdup(ctxt->name);
	    depth = ctxt->nameNr;
	    continue;
	}

	if ((CUR != 0) && ((xmlStrEqual(currentNode, BAD_CAST"script")) ||
	    (xmlStrEqual(currentNode, BAD_CAST"style")))) {
	    /*
	     * Handle SCRIPT/STYLE separately
	     */
	    htmlParseScript(ctxt);
	} else {
	    /*
	     * Sometimes DOCTYPE arrives in the middle of the document
	     */
	    if ((CUR == '<') && (NXT(1) == '!') &&
		(UPP(2) == 'D') && (UPP(3) == 'O') &&
		(UPP(4) == 'C') && (UPP(5) == 'T') &&
		(UPP(6) == 'Y') && (UPP(7) == 'P') &&
		(UPP(8) == 'E')) {
		htmlParseErr(ctxt, XML_HTML_STRUCURE_ERROR,
		             "Misplaced DOCTYPE declaration\n",
			     BAD_CAST "DOCTYPE" , NULL);
		htmlParseDocTypeDecl(ctxt);
	    }

	    /*
	     * First case :  a comment
	     */
	    if ((CUR == '<') && (NXT(1) == '!') &&
		(NXT(2) == '-') && (NXT(3) == '-')) {
		htmlParseComment(ctxt);
	    }

	    /*
	     * Second case : a Processing Instruction.
	     */
	    else if ((CUR == '<') && (NXT(1) == '?')) {
		htmlParsePI(ctxt);
	    }

	    /*
	     * Third case :  a sub-element.
	     */
	    else if (CUR == '<') {
		htmlParseElementInternal(ctxt);
		if (currentNode != NULL) xmlFree(currentNode);

		currentNode = xmlStrdup(ctxt->name);
		depth = ctxt->nameNr;
	    }

	    /*
	     * Fourth case : a reference. If if has not been resolved,
	     *    parsing returns it's Name, create the node
	     */
	    else if (CUR == '&') {
		htmlParseReference(ctxt);
	    }

	    /*
	     * Fifth case : end of the resource
	     */
	    else if (CUR == 0) {
		htmlAutoCloseOnEnd(ctxt);
		break;
	    }

	    /*
	     * Last case, text. Note that References are handled directly.
	     */
	    else {
		htmlParseCharData(ctxt);
	    }
	}
        GROW;
    }
    if (currentNode != NULL) xmlFree(currentNode);
}